

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void MonitoredItem_delete(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  MonitoredItem_queuedValue *pMVar1;
  UA_MonitoredItem *pUVar2;
  MonitoredItem_queuedValue *pMVar3;
  MonitoredItem_queuedValue *__ptr;
  
  if (monitoredItem->sampleJobIsRegistered == true) {
    monitoredItem->sampleJobIsRegistered = false;
    UA_Server_removeRepeatedJob(server,monitoredItem->sampleJobGuid);
  }
  __ptr = (monitoredItem->queue).tqh_first;
  if (__ptr != (MonitoredItem_queuedValue *)0x0) {
    do {
      pMVar1 = (__ptr->listEntry).tqe_next;
      pMVar3 = pMVar1;
      if (pMVar1 == (MonitoredItem_queuedValue *)0x0) {
        pMVar3 = (MonitoredItem_queuedValue *)&monitoredItem->queue;
      }
      (pMVar3->listEntry).tqe_prev = (__ptr->listEntry).tqe_prev;
      *(__ptr->listEntry).tqe_prev = pMVar1;
      deleteMembers_noInit(&__ptr->value,UA_TYPES + 0x16);
      (__ptr->value).serverTimestamp = 0;
      *(undefined8 *)&(__ptr->value).serverPicoseconds = 0;
      (__ptr->value).sourceTimestamp = 0;
      *(undefined8 *)&(__ptr->value).sourcePicoseconds = 0;
      (__ptr->value).value.arrayDimensions = (UA_UInt32 *)0x0;
      *(undefined8 *)&(__ptr->value).status = 0;
      (__ptr->value).value.data = (void *)0x0;
      (__ptr->value).value.arrayDimensionsSize = 0;
      *(undefined8 *)&(__ptr->value).value.storageType = 0;
      (__ptr->value).value.arrayLength = 0;
      *(undefined8 *)&__ptr->value = 0;
      (__ptr->value).value.type = (UA_DataType *)0x0;
      free(__ptr);
      __ptr = pMVar1;
    } while (pMVar1 != (MonitoredItem_queuedValue *)0x0);
  }
  monitoredItem->currentQueueSize = 0;
  pUVar2 = (monitoredItem->listEntry).le_next;
  if (pUVar2 != (UA_MonitoredItem *)0x0) {
    (pUVar2->listEntry).le_prev = (monitoredItem->listEntry).le_prev;
  }
  *(monitoredItem->listEntry).le_prev = pUVar2;
  deleteMembers_noInit(&monitoredItem->indexRange,UA_TYPES + 0xb);
  (monitoredItem->indexRange).length = 0;
  (monitoredItem->indexRange).data = (UA_Byte *)0x0;
  deleteMembers_noInit(&monitoredItem->lastSampledValue,UA_TYPES + 0xe);
  (monitoredItem->lastSampledValue).length = 0;
  (monitoredItem->lastSampledValue).data = (UA_Byte *)0x0;
  deleteMembers_noInit(&monitoredItem->monitoredNodeId,UA_TYPES + 0x10);
  (monitoredItem->monitoredNodeId).namespaceIndex = 0;
  *(undefined2 *)&(monitoredItem->monitoredNodeId).field_0x2 = 0;
  (monitoredItem->monitoredNodeId).identifierType = UA_NODEIDTYPE_NUMERIC;
  (monitoredItem->monitoredNodeId).identifier.string.length = 0;
  (monitoredItem->monitoredNodeId).identifier.string.data = (UA_Byte *)0x0;
  free(monitoredItem);
  return;
}

Assistant:

void MonitoredItem_delete(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    MonitoredItem_unregisterSampleJob(server, monitoredItem);
    /* clear the queued samples */
    MonitoredItem_queuedValue *val, *val_tmp;
    TAILQ_FOREACH_SAFE(val, &monitoredItem->queue, listEntry, val_tmp) {
        TAILQ_REMOVE(&monitoredItem->queue, val, listEntry);
        UA_DataValue_deleteMembers(&val->value);
        UA_free(val);
    }
    monitoredItem->currentQueueSize = 0;
    LIST_REMOVE(monitoredItem, listEntry);
    UA_String_deleteMembers(&monitoredItem->indexRange);
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    UA_NodeId_deleteMembers(&monitoredItem->monitoredNodeId);
    UA_free(monitoredItem);
}